

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O0

__pid_t __thiscall kj::UnixEventPort::wait(UnixEventPort *this,void *__stat_loc)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  undefined4 extraout_var_00;
  int *piVar5;
  size_t sVar6;
  undefined7 extraout_var;
  long *in_FS_OFFSET;
  char (*in_stack_fffffffffffffc58) [14];
  Fault local_340;
  Fault f_4;
  int error;
  Fault f_3;
  SyscallResult local_320 [2];
  SyscallResult _kjSyscallResult_2;
  Fault f_2;
  SyscallResult local_2fc;
  SignalPromiseAdapter *pSStack_2f8;
  SyscallResult _kjSyscallResult_1;
  SignalPromiseAdapter *ptr;
  sigset_t waitMask;
  undefined1 local_268 [4];
  int n;
  epoll_event events [16];
  int local_1a0 [2];
  void *local_198;
  Duration local_190;
  undefined1 local_188 [36];
  int timeout;
  Fault f_1;
  String local_158;
  char *local_140;
  String local_138;
  int local_11c;
  undefined1 local_118 [4];
  int i;
  Vector<kj::String> changes;
  ArrayPtr<unsigned_char> local_e8;
  ArrayPtr<__sigset_t> local_d8;
  ArrayPtr<unsigned_char> local_c8 [2];
  Fault local_a8;
  Fault f;
  SyscallResult local_94;
  undefined1 local_90 [4];
  SyscallResult _kjSyscallResult;
  sigset_t currentMask;
  UnixEventPort *this_local;
  
  this->sleeping = false;
  memset(local_90,0,0x80);
  f.exception = (Exception *)local_90;
  local_94 = kj::_::Debug::syscall<kj::UnixEventPort::wait()::__0>
                       ((anon_class_8_1_3563be65 *)&f,false);
  pvVar4 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_94);
  if (pvVar4 == (void *)0x0) {
    iVar3 = kj::_::Debug::SyscallResult::getErrorNumber(&local_94);
    kj::_::Debug::Fault::Fault
              (&local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0x227,iVar3,"sigprocmask(0, nullptr, &currentMask)","");
    kj::_::Debug::Fault::fatal(&local_a8);
  }
  local_d8 = arrayPtr<__sigset_t>((__sigset_t *)local_90);
  local_c8[0] = ArrayPtr<__sigset_t>::asBytes(&local_d8);
  join_0x00000010_0x00000000_ = arrayPtr<__sigset_t>(&this->originalMask);
  local_e8 = ArrayPtr<__sigset_t>::asBytes((ArrayPtr<__sigset_t> *)&changes.builder.disposer);
  bVar1 = ArrayPtr<unsigned_char>::operator==(local_c8,&local_e8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    iVar3 = (**this->clock->_vptr_MonotonicClock)();
    local_190.value = CONCAT44(extraout_var_00,iVar3);
    local_198 = (void *)0xf4240;
    MaxValue_::operator_cast_to_int((MaxValue_ *)&kj::maxValue);
    TimerImpl::timeoutToNextEvent
              ((TimerImpl *)local_188,(TimePoint)&this->timerImpl,local_190,(uint64_t)local_198);
    Maybe<unsigned_long>::
    map<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_c__:574:16)>
              ((Maybe<unsigned_long> *)(local_188 + 0x14),(anon_class_1_0_00000001 *)local_188);
    local_1a0[0] = -1;
    piVar5 = Maybe<int>::orDefault((Maybe<int> *)(local_188 + 0x14),local_1a0);
    iVar3 = *piVar5;
    Maybe<int>::~Maybe((Maybe<int> *)(local_188 + 0x14));
    Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)local_188);
    local_188._28_4_ = iVar3;
    if ((this->signalHead == (SignalPromiseAdapter *)0x0) &&
       (bVar1 = Maybe<kj::Own<kj::UnixEventPort::ChildSet,_std::nullptr_t>_>::operator==
                          (&this->childSet), ((bVar1 ^ 0xffU) & 1) == 0)) {
      iVar3 = OwnFd::operator_cast_to_int(&this->epollFd);
      sVar6 = size<epoll_event,16ul>((epoll_event (*) [16])local_268);
      waitMask.__val[0xf]._4_4_ =
           epoll_wait(iVar3,(epoll_event *)local_268,(int)sVar6,local_188._28_4_);
    }
    else {
      memcpy(&ptr,&this->originalMask,0x80);
      for (pSStack_2f8 = this->signalHead; pSStack_2f8 != (SignalPromiseAdapter *)0x0;
          pSStack_2f8 = pSStack_2f8->next) {
        f_2.exception = (Exception *)&ptr;
        local_2fc = kj::_::Debug::syscall<kj::UnixEventPort::wait()::__2>
                              ((anon_class_16_2_9513aa98 *)&f_2,false);
        pvVar4 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_2fc);
        if (pvVar4 == (void *)0x0) {
          iVar3 = kj::_::Debug::SyscallResult::getErrorNumber(&local_2fc);
          kj::_::Debug::Fault::Fault
                    ((Fault *)&_kjSyscallResult_2,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                     ,0x25e,iVar3,"sigdelset(&waitMask, ptr->signum)","");
          kj::_::Debug::Fault::fatal((Fault *)&_kjSyscallResult_2);
        }
      }
      bVar1 = Maybe<kj::Own<kj::UnixEventPort::ChildSet,_std::nullptr_t>_>::operator==
                        (&this->childSet);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        f_3.exception = (Exception *)&ptr;
        local_320[0] = kj::_::Debug::syscall<kj::UnixEventPort::wait()::__3>
                                 ((anon_class_8_1_f6886f7f *)&f_3,false);
        pvVar4 = kj::_::Debug::SyscallResult::operator_cast_to_void_(local_320);
        if (pvVar4 == (void *)0x0) {
          iVar3 = kj::_::Debug::SyscallResult::getErrorNumber(local_320);
          kj::_::Debug::Fault::Fault
                    ((Fault *)&stack0xfffffffffffffcd0,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                     ,0x262,iVar3,"sigdelset(&waitMask, SIGCHLD)","");
          kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffcd0);
        }
      }
      *(UnixEventPort **)(*in_FS_OFFSET + -0x20) = this;
      iVar3 = OwnFd::operator_cast_to_int(&this->epollFd);
      sVar6 = size<epoll_event,16ul>((epoll_event (*) [16])local_268);
      waitMask.__val[0xf]._4_4_ =
           epoll_pwait(iVar3,(epoll_event *)local_268,(int)sVar6,local_188._28_4_,(__sigset_t *)&ptr
                      );
      *(undefined8 *)(*in_FS_OFFSET + -0x20) = 0;
    }
    if (waitMask.__val[0xf]._4_4_ < 0) {
      piVar5 = __errno_location();
      f_4.exception._4_4_ = *piVar5;
      if (f_4.exception._4_4_ != 4) {
        kj::_::Debug::Fault::Fault
                  (&local_340,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                   ,0x277,f_4.exception._4_4_,"epoll_pwait()","");
        kj::_::Debug::Fault::fatal(&local_340);
      }
      waitMask.__val[0xf]._4_4_ = 0;
      f_4.exception._4_4_ = 4;
    }
    bVar1 = processEpollEvents(this,(epoll_event *)local_268,waitMask.__val[0xf]._4_4_);
    return (__pid_t)CONCAT71(extraout_var,bVar1);
  }
  Vector<kj::String>::Vector((Vector<kj::String> *)local_118);
  for (local_11c = 0; iVar3 = local_11c, iVar2 = __libc_current_sigrtmax(), iVar3 <= iVar2;
      local_11c = local_11c + 1) {
    iVar3 = sigismember((sigset_t *)local_90,local_11c);
    if ((iVar3 == 0) || (iVar3 = sigismember((sigset_t *)&this->originalMask,local_11c), iVar3 != 0)
       ) {
      iVar3 = sigismember((sigset_t *)local_90,local_11c);
      if ((iVar3 == 0) &&
         (iVar3 = sigismember((sigset_t *)&this->originalMask,local_11c), iVar3 != 0)) {
        f_1.exception = (Exception *)strsignal(local_11c);
        str<char_const(&)[9],int&,char_const(&)[3],char*,char_const(&)[14]>
                  (&local_158,(kj *)0x96cc98,(char (*) [9])&local_11c,(int *)" (",(char (*) [3])&f_1
                   ,(char **)") was removed",in_stack_fffffffffffffc58);
        Vector<kj::String>::add<kj::String>((Vector<kj::String> *)local_118,&local_158);
        String::~String(&local_158);
      }
    }
    else {
      local_140 = strsignal(local_11c);
      str<char_const(&)[9],int&,char_const(&)[3],char*,char_const(&)[12]>
                (&local_138,(kj *)0x96cc98,(char (*) [9])&local_11c,(int *)" (",
                 (char (*) [3])&local_140,(char **)") was added",
                 (char (*) [12])in_stack_fffffffffffffc58);
      Vector<kj::String>::add<kj::String>((Vector<kj::String> *)local_118,&local_138);
      String::~String(&local_138);
    }
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[472],kj::Vector<kj::String>&>
            ((Fault *)(local_188 + 0x20),
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
             ,0x238,FAILED,(char *)0x0,
             "\"Signal mask has changed since UnixEventPort was constructed. You are required to \" \"ensure that whenever control returns to the event loop, the signal mask is the same \" \"as it was when UnixEventPort was created. In non-debug builds, this check is skipped, \" \"and this situation may instead lead to unexpected results. In particular, while the \" \"system is waiting for I/O events, the signal mask may be reverted to what it was at \" \"construction time, ignoring your subsequent changes.\", changes"
             ,(char (*) [472])
              "Signal mask has changed since UnixEventPort was constructed. You are required to ensure that whenever control returns to the event loop, the signal mask is the same as it was when UnixEventPort was created. In non-debug builds, this check is skipped, and this situation may instead lead to unexpected results. In particular, while the system is waiting for I/O events, the signal mask may be reverted to what it was at construction time, ignoring your subsequent changes."
             ,(Vector<kj::String> *)local_118);
  kj::_::Debug::Fault::fatal((Fault *)(local_188 + 0x20));
}

Assistant:

bool UnixEventPort::wait() {
  sleeping = false;

#ifdef KJ_DEBUG
  // In debug mode, verify the current signal mask matches the original.
  {
    sigset_t currentMask;
    memset(&currentMask, 0, sizeof(currentMask));
    KJ_SYSCALL(sigprocmask(0, nullptr, &currentMask));
    if (arrayPtr(currentMask).asBytes() != arrayPtr(originalMask).asBytes()) {
      kj::Vector<kj::String> changes;
      for (int i = 0; i <= SIGRTMAX; i++) {
        if (sigismember(&currentMask, i) && !sigismember(&originalMask, i)) {
          changes.add(kj::str("signal #", i, " (", strsignal(i), ") was added"));
        } else if (!sigismember(&currentMask, i) && sigismember(&originalMask, i)) {
          changes.add(kj::str("signal #", i, " (", strsignal(i), ") was removed"));
        }
      }

      KJ_FAIL_REQUIRE(
          "Signal mask has changed since UnixEventPort was constructed. You are required to "
          "ensure that whenever control returns to the event loop, the signal mask is the same "
          "as it was when UnixEventPort was created. In non-debug builds, this check is skipped, "
          "and this situation may instead lead to unexpected results. In particular, while the "
          "system is waiting for I/O events, the signal mask may be reverted to what it was at "
          "construction time, ignoring your subsequent changes.", changes);
    }
  }
#endif

  int timeout = timerImpl.timeoutToNextEvent(clock.now(), MILLISECONDS, int(maxValue))
          .map([](uint64_t t) -> int { return t; })
          .orDefault(-1);

  struct epoll_event events[16];
  int n;
  if (signalHead != nullptr || childSet != kj::none) {
    // We are interested in some signals. Use epoll_pwait().
    //
    // Note: Once upon a time, we used signalfd for this. However, this turned out to be more
    // trouble than it was worth. Some problems with signalfd:
    // - It required opening an additional file descriptor per thread.
    // - If the set of interesting signals changed, the signalfd would have to be updated before
    //   calling epoll_wait(), which was an extra syscall.
    // - When a signal arrives, it requires extra syscalls to read the signal info from the
    //   signalfd, as well as code to translate from signalfd_siginfo to siginfo_t, which are
    //   different for some reason.
    // - signalfd suffers from surprising lock contention during epoll_wait or when the signalfd's
    //   mask is updated in programs with many threads. Because the lock is a spinlock, this
    //   could consume exorbitant CPU.
    // - When a signalfd is in an epoll, it will be flagged readable based on signals which are
    //   pending in the process/thread which called epoll_ctl_add() to register the signalfd.
    //   This is mostly fine for our usage, except that it breaks one useful case that otherwise
    //   works: many servers are designed to "daemonize" themselves by fork()ing and then having
    //   the parent process exit while the child thread lives on. In this case, if a UnixEventPort
    //   had been created before daemonizing, signal handling would be forever broken in the child.

    sigset_t waitMask = originalMask;

    // Unblock the signals we care about.
    {
      auto ptr = signalHead;
      while (ptr != nullptr) {
        KJ_SYSCALL(sigdelset(&waitMask, ptr->signum));
        ptr = ptr->next;
      }
      if (childSet != kj::none) {
        KJ_SYSCALL(sigdelset(&waitMask, SIGCHLD));
      }
    }

    threadEventPort = this;
    n = epoll_pwait(epollFd, events, kj::size(events), timeout, &waitMask);
    threadEventPort = nullptr;
  } else {
    // Not waiting on any signals. Regular epoll_wait() will be fine.
    n = epoll_wait(epollFd, events, kj::size(events), timeout);
  }

  if (n < 0) {
    int error = errno;
    if (error == EINTR) {
      // We received a signal. The signal handler may have queued an event to the event loop. Even
      // if it didn't, we can't simply restart the epoll call because we need to recompute the
      // timeout. Instead, we pretend epoll_wait() returned zero events. This will cause the event
      // loop to spin once, decide it has nothing to do, recompute timeouts, then return to waiting.
      n = 0;
    } else {
      KJ_FAIL_SYSCALL("epoll_pwait()", error);
    }
  }

  return processEpollEvents(events, n);
}